

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O0

UniquePtr<EVP_PKEY> old_priv_decode(CBS *cbs,int type)

{
  bool bVar1;
  EVP_PKEY *__p;
  EC_KEY *__p_00;
  pointer peVar2;
  pointer key;
  DSA *__p_01;
  pointer key_00;
  RSA *__p_02;
  pointer key_01;
  int in_EDX;
  undefined4 in_register_00000034;
  CBS *cbs_00;
  unique_ptr<rsa_st,_bssl::internal::Deleter> local_48;
  UniquePtr<RSA> rsa;
  UniquePtr<DSA> dsa;
  UniquePtr<EC_KEY> ec_key;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_28;
  UniquePtr<EVP_PKEY> ret;
  int type_local;
  CBS *cbs_local;
  
  cbs_00 = (CBS *)CONCAT44(in_register_00000034,type);
  ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._4_4_ = in_EDX;
  __p = EVP_PKEY_new();
  std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&local_28,(pointer)__p);
  bVar1 = std::operator==(&local_28,(nullptr_t)0x0);
  if (bVar1) {
    std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)cbs,(nullptr_t)0x0);
  }
  else if (ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._4_4_ == 6) {
    __p_02 = RSA_parse_private_key(cbs_00);
    std::unique_ptr<rsa_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<rsa_st,bssl::internal::Deleter> *)&local_48,__p_02);
    bVar1 = std::operator==(&local_48,(nullptr_t)0x0);
    if (bVar1) {
      std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)cbs,(nullptr_t)0x0);
    }
    else {
      peVar2 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_28);
      key_01 = std::unique_ptr<rsa_st,_bssl::internal::Deleter>::release(&local_48);
      EVP_PKEY_assign_RSA(peVar2,key_01);
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::unique_ptr
                ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)cbs,&local_28);
    }
    std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr(&local_48);
  }
  else if (ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._4_4_ == 0x74) {
    __p_01 = DSA_parse_private_key(cbs_00);
    std::unique_ptr<dsa_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<dsa_st,bssl::internal::Deleter> *)&rsa,__p_01);
    bVar1 = std::operator==((unique_ptr<dsa_st,_bssl::internal::Deleter> *)&rsa,(nullptr_t)0x0);
    if (bVar1) {
      std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)cbs,(nullptr_t)0x0);
    }
    else {
      peVar2 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_28);
      key_00 = std::unique_ptr<dsa_st,_bssl::internal::Deleter>::release
                         ((unique_ptr<dsa_st,_bssl::internal::Deleter> *)&rsa);
      EVP_PKEY_assign_DSA(peVar2,key_00);
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::unique_ptr
                ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)cbs,&local_28);
    }
    std::unique_ptr<dsa_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<dsa_st,_bssl::internal::Deleter> *)&rsa);
  }
  else if (ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._4_4_ == 0x198) {
    __p_00 = EC_KEY_parse_private_key(cbs_00,(EC_GROUP *)0x0);
    std::unique_ptr<ec_key_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ec_key_st,bssl::internal::Deleter> *)&dsa,__p_00);
    bVar1 = std::operator==((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&dsa,(nullptr_t)0x0);
    if (bVar1) {
      std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)cbs,(nullptr_t)0x0);
    }
    else {
      peVar2 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_28);
      key = std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::release
                      ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&dsa);
      EVP_PKEY_assign_EC_KEY(peVar2,key);
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::unique_ptr
                ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)cbs,&local_28);
    }
    std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&dsa);
  }
  else {
    ERR_put_error(6,0,0x7f,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                  ,0xbc);
    std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)cbs,(nullptr_t)0x0);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  return (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)cbs;
}

Assistant:

static bssl::UniquePtr<EVP_PKEY> old_priv_decode(CBS *cbs, int type) {
  bssl::UniquePtr<EVP_PKEY> ret(EVP_PKEY_new());
  if (ret == nullptr) {
    return nullptr;
  }

  switch (type) {
    case EVP_PKEY_EC: {
      bssl::UniquePtr<EC_KEY> ec_key(EC_KEY_parse_private_key(cbs, nullptr));
      if (ec_key == nullptr) {
        return nullptr;
      }
      EVP_PKEY_assign_EC_KEY(ret.get(), ec_key.release());
      return ret;
    }
    case EVP_PKEY_DSA: {
      bssl::UniquePtr<DSA> dsa(DSA_parse_private_key(cbs));
      if (dsa == nullptr) {
        return nullptr;
      }
      EVP_PKEY_assign_DSA(ret.get(), dsa.release());
      return ret;
    }
    case EVP_PKEY_RSA: {
      bssl::UniquePtr<RSA> rsa(RSA_parse_private_key(cbs));
      if (rsa == nullptr) {
        return nullptr;
      }
      EVP_PKEY_assign_RSA(ret.get(), rsa.release());
      return ret;
    }
    default:
      OPENSSL_PUT_ERROR(EVP, EVP_R_UNKNOWN_PUBLIC_KEY_TYPE);
      return nullptr;
  }
}